

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vertex.cpp
# Opt level: O0

Vertex * __thiscall Vertex::getSequence_abi_cxx11_(Vertex *this)

{
  long in_RSI;
  Vertex *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x28));
  return this;
}

Assistant:

string Vertex::getSequence(){
    return this->seq;
}